

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyDropEmptyElements(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  Node *pNVar2;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pNVar2 = node;
  while (next = pNVar2, next != (Node *)0x0) {
    pNVar2 = next->next;
    if (next->content != (Node *)0x0) {
      prvTidyDropEmptyElements(doc,next->content);
    }
    BVar1 = prvTidynodeIsElement(next);
    if ((BVar1 != no) ||
       ((BVar1 = prvTidynodeIsText(next), BVar1 != no && (next->end <= next->start)))) {
      pNVar2 = prvTidyTrimEmptyElement(doc,next);
    }
  }
  return (Node *)0x0;
}

Assistant:

Node* TY_(DropEmptyElements)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->content)
            TY_(DropEmptyElements)(doc, node->content);

        if (!TY_(nodeIsElement)(node) &&
            !(TY_(nodeIsText)(node) && !(node->start < node->end)))
        {
            node = next;
            continue;
        }

        next = TY_(TrimEmptyElement)(doc, node);
        node = next;
    }

    return node;
}